

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeMemoryContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  Module *pMVar1;
  size_type sVar2;
  reference this_00;
  pointer pDVar3;
  long lVar4;
  size_type sVar5;
  ExpressionRunner<wasm::ModuleRunner> *pEVar6;
  Name NVar7;
  Flow local_1e0;
  Flow local_198;
  undefined1 local_150 [8];
  DataDrop drop;
  MemoryInit init;
  Literal local_e0;
  undefined1 local_c8 [8];
  Const size;
  Literal local_88;
  undefined1 local_70 [8];
  Const zero;
  Memory *memory;
  value_type *segment;
  size_t e;
  size_t i;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  initializeMemorySizes(this);
  e = 0;
  sVar2 = std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::size(&this->wasm->dataSegments);
  for (; e < sVar2; e = e + 1) {
    this_00 = std::
              vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ::operator[](&this->wasm->dataSegments,e);
    pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (this_00);
    if ((pDVar3->isPassive & 1U) == 0) {
      pMVar1 = this->wasm;
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(this_00);
      zero.value.type.id = (pDVar3->memory).super_IString.str._M_len;
      NVar7.super_IString.str._M_str = (char *)zero.value.type.id;
      NVar7.super_IString.str._M_len = (size_t)pMVar1;
      lVar4 = ::wasm::Module::getMemory(NVar7);
      Const::Const((Const *)local_70);
      wasm::Literal::makeFromInt32(&local_88,0,(Type)*(uintptr_t *)(lVar4 + 0x50));
      ::wasm::Literal::operator=
                ((Literal *)
                 &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                 &local_88);
      ::wasm::Literal::~Literal(&local_88);
      ::wasm::Const::finalize();
      Const::Const((Const *)local_c8);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(this_00);
      sVar5 = std::vector<char,_std::allocator<char>_>::size(&pDVar3->data);
      init.memory.super_IString.str._M_str = *(char **)(lVar4 + 0x50);
      wasm::Literal::makeFromInt32
                (&local_e0,(int32_t)sVar5,(Type)init.memory.super_IString.str._M_str);
      ::wasm::Literal::operator=
                ((Literal *)
                 &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                 &local_e0);
      ::wasm::Literal::~Literal(&local_e0);
      ::wasm::Const::finalize();
      MemoryInit::MemoryInit((MemoryInit *)&drop.segment.super_IString.str._M_str);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(this_00);
      Name::operator=((Name *)&init.size,&pDVar3->memory);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(this_00);
      Name::operator=((Name *)&init.super_SpecificExpression<(wasm::Expression::Id)36>.
                               super_Expression.type,(Name *)pDVar3);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(this_00);
      init.segment.super_IString.str._M_str = (char *)pDVar3->offset;
      init.dest = (Expression *)local_70;
      init.offset = (Expression *)local_c8;
      ::wasm::MemoryInit::finalize();
      DataDrop::DataDrop((DataDrop *)local_150);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(this_00);
      Name::operator=((Name *)&drop.super_SpecificExpression<(wasm::Expression::Id)37>.
                               super_Expression.type,(Name *)pDVar3);
      ::wasm::DataDrop::finalize();
      pEVar6 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                (&local_198,pEVar6,(Expression *)&drop.segment.super_IString.str._M_str);
      Flow::~Flow(&local_198);
      pEVar6 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit(&local_1e0,pEVar6,(Expression *)local_150);
      Flow::~Flow(&local_1e0);
      Const::~Const((Const *)local_c8);
      Const::~Const((Const *)local_70);
    }
  }
  return;
}

Assistant:

void initializeMemoryContents() {
    initializeMemorySizes();

    // apply active memory segments
    for (size_t i = 0, e = wasm.dataSegments.size(); i < e; ++i) {
      auto& segment = wasm.dataSegments[i];
      if (segment->isPassive) {
        continue;
      }

      auto* memory = wasm.getMemory(segment->memory);

      Const zero;
      zero.value = Literal::makeFromInt32(0, memory->addressType);
      zero.finalize();

      Const size;
      size.value =
        Literal::makeFromInt32(segment->data.size(), memory->addressType);
      size.finalize();

      MemoryInit init;
      init.memory = segment->memory;
      init.segment = segment->name;
      init.dest = segment->offset;
      init.offset = &zero;
      init.size = &size;
      init.finalize();

      DataDrop drop;
      drop.segment = segment->name;
      drop.finalize();

      self()->visit(&init);
      self()->visit(&drop);
    }
  }